

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

int run_test_threadpool_cancel_work(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint i;
  uv_loop_t *loop;
  uv_work_t reqs [16];
  cancel_info ci;
  
  reqs[0xf].work_req.wq.prev = (uv__queue *)&loop;
  ci.reqs._0_4_ = 0x10;
  ci.reqs._4_4_ = 0x80;
  loop_00 = uv_default_loop();
  saturate_threadpool();
  for (eval_a._4_4_ = 0; eval_a._4_4_ < 0x10; eval_a._4_4_ = eval_a._4_4_ + 1) {
    iVar1 = uv_queue_work(loop_00,(uv_work_t *)&reqs[(ulong)eval_a._4_4_ - 1].work_req.wq.prev,
                          work2_cb,done2_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
              ,0x12f,"uv_queue_work(loop, reqs + i, work2_cb, done2_cb)","==","0",(long)iVar1,"==",0
             );
      abort();
    }
  }
  iVar1 = uv_timer_init(loop_00,(uv_timer_t *)&ci.nreqs);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x131,"uv_timer_init(loop, &ci.timer_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)&ci.nreqs,timer_cb,10,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x132,"uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x133,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x134,"1","==","timer_cb_called",1,"==",(ulong)timer_cb_called);
    abort();
  }
  if ((ulong)done2_cb_called != 0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x135,"(sizeof(reqs) / sizeof((reqs)[0]))","==","done2_cb_called",0x10,"==",
            (ulong)done2_cb_called);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x137,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(threadpool_cancel_work) {
  struct cancel_info ci;
  uv_work_t reqs[16];
  uv_loop_t* loop;
  unsigned i;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  for (i = 0; i < ARRAY_SIZE(reqs); i++)
    ASSERT_OK(uv_queue_work(loop, reqs + i, work2_cb, done2_cb));

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);
  ASSERT_EQ(ARRAY_SIZE(reqs), done2_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}